

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O1

QMdiSubWindow * __thiscall
QMdiArea::addSubWindow(QMdiArea *this,QWidget *widget,WindowFlags windowFlags)

{
  QMdiAreaPrivate *this_00;
  QWidget *this_01;
  qsizetype qVar1;
  QWidget *pQVar2;
  QWidget *pQVar3;
  long in_FS_OFFSET;
  QMdiSubWindow *child;
  QWidget *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (widget == (QWidget *)0x0) {
    addSubWindow();
    pQVar3 = (QWidget *)0x0;
  }
  else {
    this_00 = *(QMdiAreaPrivate **)
               &(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
    this_01 = QWidget::focusWidget(widget);
    local_40 = (QWidget *)QMetaObject::cast((QObject *)&QMdiSubWindow::staticMetaObject);
    if (local_40 == (QWidget *)0x0) {
      pQVar3 = (QWidget *)operator_new(0x28);
      pQVar2 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
      QMdiSubWindow::QMdiSubWindow((QMdiSubWindow *)pQVar3,pQVar2,windowFlags);
      local_40 = pQVar3;
      QWidget::setAttribute(pQVar3,WA_DeleteOnClose,true);
      QMdiSubWindow::setWidget((QMdiSubWindow *)local_40,widget);
    }
    else {
      qVar1 = QtPrivate::indexOf<QPointer<QMdiSubWindow>,QMdiSubWindow*>
                        (&this_00->childWindows,(QMdiSubWindow **)&local_40,0);
      pQVar3 = local_40;
      if (qVar1 != -1) {
        addSubWindow();
        pQVar3 = local_40;
        goto LAB_0044a9f2;
      }
      pQVar2 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
      if ((QFlagsStorage<Qt::WindowType>)
          windowFlags.super_QFlagsStorageHelper<Qt::WindowType,_4>.
          super_QFlagsStorage<Qt::WindowType>.i == (QFlagsStorage<Qt::WindowType>)0x0) {
        windowFlags.super_QFlagsStorageHelper<Qt::WindowType,_4>.super_QFlagsStorage<Qt::WindowType>
        .i = (QFlagsStorageHelper<Qt::WindowType,_4>)
             (local_40->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
             super_QFlagsStorage<Qt::WindowType>.i;
      }
      QWidget::setParent(pQVar3,pQVar2,windowFlags);
    }
    QMdiAreaPrivate::appendChild(this_00,(QMdiSubWindow *)local_40);
    pQVar3 = local_40;
    if (this_01 != (QWidget *)0x0) {
      QWidget::setFocus(this_01,OtherFocusReason);
      pQVar3 = local_40;
    }
  }
LAB_0044a9f2:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QMdiSubWindow *)pQVar3;
}

Assistant:

QMdiSubWindow *QMdiArea::addSubWindow(QWidget *widget, Qt::WindowFlags windowFlags)
{
    if (Q_UNLIKELY(!widget)) {
        qWarning("QMdiArea::addSubWindow: null pointer to widget");
        return nullptr;
    }

    Q_D(QMdiArea);
    // QWidget::setParent clears focusWidget so store it
    QWidget *childFocus = widget->focusWidget();
    QMdiSubWindow *child = qobject_cast<QMdiSubWindow *>(widget);

    // Widget is already a QMdiSubWindow
    if (child) {
        if (Q_UNLIKELY(d->childWindows.indexOf(child) != -1)) {
            qWarning("QMdiArea::addSubWindow: window is already added");
            return child;
        }
        child->setParent(viewport(), windowFlags ? windowFlags : child->windowFlags());
    // Create a QMdiSubWindow
    } else {
        child = new QMdiSubWindow(viewport(), windowFlags);
        child->setAttribute(Qt::WA_DeleteOnClose);
        child->setWidget(widget);
        Q_ASSERT(child->testAttribute(Qt::WA_DeleteOnClose));
    }

    d->appendChild(child);

    if (childFocus)
        childFocus->setFocus();

    return child;
}